

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O1

void raw_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  Raw *raw;
  Socket *pSVar1;
  char cVar2;
  
  raw = (Raw *)(plug + -9);
  if (type == PLUGCLOSE_NORMAL) {
    if (*(char *)&plug[-3].vt == '\0') {
      cVar2 = (**(code **)((plug[-6].vt)->log + 8))();
      if ((cVar2 != '\0') && (*(char *)((long)&plug[-3].vt + 1) == '\0')) {
        pSVar1 = raw->s;
        if (pSVar1 != (Socket *)0x0) {
          (*pSVar1->vt->write_eof)(pSVar1);
        }
        *(undefined1 *)((long)&plug[-3].vt + 1) = 1;
      }
    }
    *(undefined1 *)&plug[-3].vt = 1;
    raw_check_close(raw);
    return;
  }
  pSVar1 = raw->s;
  if (pSVar1 != (Socket *)0x0) {
    (*pSVar1->vt->close)(pSVar1);
    plug[-9].vt = (PlugVtable *)0x0;
    *(undefined1 *)&plug[-8].vt = 1;
    (**(code **)((plug[-6].vt)->log + 0x30))();
    (**(code **)((plug[-6].vt)->log + 0x38))();
  }
  logevent((LogContext *)plug[-5].vt,error_msg);
  if (type == PLUGCLOSE_USER_ABORT) {
    return;
  }
  seat_connection_fatal((Seat *)plug[-6].vt,"%s",error_msg);
  return;
}

Assistant:

static void raw_closing(Plug *plug, PlugCloseType type, const char *error_msg)
{
    Raw *raw = container_of(plug, Raw, plug);

    if (type != PLUGCLOSE_NORMAL) {
        /* A socket error has occurred. */
        if (raw->s) {
            sk_close(raw->s);
            raw->s = NULL;
            raw->closed_on_socket_error = true;
            seat_notify_remote_exit(raw->seat);
            seat_notify_remote_disconnect(raw->seat);
        }
        logevent(raw->logctx, error_msg);
        if (type != PLUGCLOSE_USER_ABORT)
            seat_connection_fatal(raw->seat, "%s", error_msg);
    } else {
        /* Otherwise, the remote side closed the connection normally. */
        if (!raw->sent_console_eof && seat_eof(raw->seat)) {
            /*
             * The front end wants us to close the outgoing side of the
             * connection as soon as we see EOF from the far end.
             */
            if (!raw->sent_socket_eof) {
                if (raw->s)
                    sk_write_eof(raw->s);
                raw->sent_socket_eof= true;
            }
        }
        raw->sent_console_eof = true;
        raw_check_close(raw);
    }
}